

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<float> * __thiscall
Fad<float>::operator+=
          (Fad<float> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_> *x)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *pFVar7;
  Fad<float> *pFVar8;
  Fad<float> *pFVar9;
  Fad<float> *pFVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  value_type vVar18;
  
  pFVar7 = (x->fadexpr_).left_;
  pFVar8 = (x->fadexpr_).right_;
  pFVar9 = (pFVar7->fadexpr_).left_;
  pFVar10 = (pFVar7->fadexpr_).right_;
  uVar3 = (pFVar9->dx_).num_elts;
  uVar4 = (pFVar10->dx_).num_elts;
  uVar15 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar15 = uVar3;
  }
  uVar5 = (pFVar8->dx_).num_elts;
  if ((int)uVar15 <= (int)uVar5) {
    uVar15 = uVar5;
  }
  if (uVar15 != 0) {
    uVar6 = (this->dx_).num_elts;
    uVar17 = (ulong)uVar6;
    if (uVar17 == 0) {
      (this->dx_).num_elts = uVar15;
      uVar17 = 0xffffffffffffffff;
      if (-1 < (int)uVar15) {
        uVar17 = (long)(int)uVar15 << 2;
      }
      pfVar14 = (float *)operator_new__(uVar17);
      (this->dx_).ptr_to_data = pfVar14;
      pFVar7 = (x->fadexpr_).left_;
      pFVar8 = (pFVar7->fadexpr_).left_;
      if ((((pFVar8->dx_).num_elts == 0) || ((((pFVar7->fadexpr_).right_)->dx_).num_elts == 0)) ||
         ((((x->fadexpr_).right_)->dx_).num_elts == 0)) {
        if (0 < (int)uVar15) {
          uVar17 = 0;
          do {
            vVar18 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::dx
                               (&x->fadexpr_,(int)uVar17);
            pfVar14[uVar17] = vVar18;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (0 < (int)uVar15) {
        pfVar11 = (pFVar8->dx_).ptr_to_data;
        pFVar9 = (pFVar7->fadexpr_).right_;
        pfVar12 = (pFVar9->dx_).ptr_to_data;
        pFVar10 = (x->fadexpr_).right_;
        pfVar13 = (pFVar10->dx_).ptr_to_data;
        uVar17 = 0;
        do {
          fVar1 = pFVar9->val_;
          fVar2 = pFVar10->val_;
          pfVar14[uVar17] =
               ((pfVar11[uVar17] * fVar1 + pfVar12[uVar17] * pFVar8->val_) * fVar2 -
               fVar1 * pFVar8->val_ * pfVar13[uVar17]) / (fVar2 * fVar2);
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
    }
    else {
      pfVar14 = (this->dx_).ptr_to_data;
      if ((uVar4 == 0 || uVar3 == 0) || uVar5 == 0) {
        if (0 < (int)uVar6) {
          uVar16 = 0;
          do {
            vVar18 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::dx
                               (&x->fadexpr_,(int)uVar16);
            pfVar14[uVar16] = vVar18 + pfVar14[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
      }
      else if (0 < (int)uVar6) {
        pfVar11 = (pFVar9->dx_).ptr_to_data;
        pfVar12 = (pFVar10->dx_).ptr_to_data;
        pfVar13 = (pFVar8->dx_).ptr_to_data;
        uVar16 = 0;
        do {
          fVar1 = pFVar8->val_;
          pfVar14[uVar16] =
               ((pfVar11[uVar16] * pFVar10->val_ + pfVar12[uVar16] * pFVar9->val_) * fVar1 -
               pFVar10->val_ * pFVar9->val_ * pfVar13[uVar16]) / (fVar1 * fVar1) + pfVar14[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
    }
  }
  pFVar7 = (x->fadexpr_).left_;
  this->val_ = (((pFVar7->fadexpr_).left_)->val_ * ((pFVar7->fadexpr_).right_)->val_) /
               ((x->fadexpr_).right_)->val_ + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}